

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O1

void __thiscall
avro::RecordSkipper::RecordSkipper(RecordSkipper *this,ResolverFactory *factory,NodePtr *writer)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Resolver *x;
  ulong uVar2;
  size_type __n;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_parse_001d21a8;
  (this->resolvers_).
  super_ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
  .
  super_reversible_ptr_container<boost::ptr_container_detail::sequence_config<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>_>,_boost::heap_clone_allocator>
  .c_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->resolvers_).
  super_ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
  .
  super_reversible_ptr_container<boost::ptr_container_detail::sequence_config<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>_>,_boost::heap_clone_allocator>
  .c_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->resolvers_).
  super_ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
  .
  super_reversible_ptr_container<boost::ptr_container_detail::sequence_config<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>_>,_boost::heap_clone_allocator>
  .c_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = (*writer->px->_vptr_Node[4])();
  __n = CONCAT44(extraout_var,iVar1);
  std::vector<void_*,_std::allocator<void_*>_>::reserve
            ((vector<void_*,_std::allocator<void_*>_> *)&this->resolvers_,__n);
  if (__n != 0) {
    uVar2 = 0;
    do {
      iVar1 = (*writer->px->_vptr_Node[5])(writer->px,uVar2 & 0xffffffff);
      x = ResolverFactory::skipper(factory,(NodePtr *)CONCAT44(extraout_var_00,iVar1));
      boost::
      ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
      ::push_back(&(this->resolvers_).
                   super_ptr_sequence_adapter<avro::Resolver,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
                  ,x);
      uVar2 = uVar2 + 1;
    } while (__n != uVar2);
  }
  return;
}

Assistant:

RecordSkipper::RecordSkipper(ResolverFactory &factory, const NodePtr &writer) :
    Resolver() 
{
    size_t leaves = writer->leaves();
    resolvers_.reserve(leaves);
    for(size_t i = 0; i < leaves; ++i) {
        const NodePtr &w = writer->leafAt(i);
        resolvers_.push_back(factory.skipper(w));
    }
}